

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_2::DeepScanLineOutputFile::initialize(DeepScanLineOutputFile *this,Header *header)

{
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  long lVar4;
  void *pvVar5;
  pointer pcVar6;
  Format FVar7;
  int iVar8;
  Box2i *pBVar9;
  LineOrder *pLVar10;
  uint *puVar11;
  Compression *pCVar12;
  Compressor *pCVar13;
  LineBuffer *pLVar14;
  long *plVar15;
  pointer pcVar16;
  Data *pDVar17;
  char *pcVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  
  Header::operator=(&this->_data->header,header);
  Header::setType(&this->_data->header,(string *)&DEEPSCANLINE_abi_cxx11_);
  pBVar9 = Header::dataWindow(header);
  pLVar10 = Header::lineOrder(header);
  iVar8 = (pBVar9->min).y;
  iVar1 = (pBVar9->max).y;
  iVar22 = iVar1;
  if (*pLVar10 == INCREASING_Y) {
    iVar22 = iVar8;
  }
  pDVar17 = this->_data;
  pDVar17->currentScanLine = iVar22;
  pDVar17->missingScanLines = (iVar1 - iVar8) + 1;
  pLVar10 = Header::lineOrder(header);
  pDVar17 = this->_data;
  pDVar17->lineOrder = *pLVar10;
  iVar8 = (pBVar9->min).y;
  iVar1 = (pBVar9->max).x;
  iVar22 = (pBVar9->max).y;
  pDVar17->minX = (pBVar9->min).x;
  pDVar17->maxX = iVar1;
  pDVar17->minY = iVar8;
  pDVar17->maxY = iVar22;
  iVar22 = iVar22 - iVar8;
  uVar20 = 0xffffffffffffffff;
  if (-2 < iVar22) {
    uVar20 = (long)iVar22 * 4 + 4;
  }
  puVar11 = (uint *)operator_new__(uVar20);
  puVar2 = (pDVar17->lineSampleCount)._data;
  if (puVar2 != (uint *)0x0) {
    operator_delete__(puVar2);
  }
  (pDVar17->lineSampleCount)._size = (long)iVar22 + 1;
  (pDVar17->lineSampleCount)._data = puVar11;
  pCVar12 = Header::compression(&this->_data->header);
  pCVar13 = newCompressor(*pCVar12,0,&this->_data->header);
  FVar7 = defaultFormat(pCVar13);
  this->_data->format = FVar7;
  iVar8 = numLinesInBuffer(pCVar13);
  this->_data->linesInBuffer = iVar8;
  if (pCVar13 != (Compressor *)0x0) {
    (*pCVar13->_vptr_Compressor[1])(pCVar13);
  }
  pDVar17 = this->_data;
  iVar8 = ((pDVar17->maxY - pDVar17->minY) + pDVar17->linesInBuffer) / pDVar17->linesInBuffer;
  Header::setChunkCount(&pDVar17->header,iVar8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->_data->lineOffsets,(long)iVar8);
  pDVar17 = this->_data;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&pDVar17->bytesPerLine,(long)((pDVar17->maxY - pDVar17->minY) + 1));
  pDVar17 = this->_data;
  iVar8 = (pDVar17->maxY - pDVar17->minY) + 1;
  if (pDVar17->linesInBuffer <= iVar8) {
    iVar8 = pDVar17->linesInBuffer;
  }
  pDVar17->maxSampleCountTableSize = (long)(((pDVar17->maxX - pDVar17->minX) + 1) * iVar8) << 2;
  pDVar17 = this->_data;
  if ((pDVar17->lineBuffers).
      super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pDVar17->lineBuffers).
      super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar20 = 0;
    do {
      pLVar14 = (LineBuffer *)operator_new(200);
      iVar8 = pDVar17->linesInBuffer;
      pcVar18 = (char *)(long)iVar8;
      *(undefined8 *)((long)&(pLVar14->exception).field_2 + 8) = 0;
      (pLVar14->_tempCountBuffer)._data = (uint *)0x0;
      *(undefined2 *)&pLVar14->_sem = 0;
      pLVar14->uncompressedData = (char *)0x0;
      pLVar14->buffer = (char *)0x0;
      pLVar14->packedDataSize = 0;
      pLVar14->unpackedDataSize = 0;
      pLVar14->minY = 0;
      pLVar14->maxY = 0;
      pLVar14->format = NATIVE;
      pLVar14->number = 0;
      pLVar14->hasException = false;
      *(undefined7 *)&pLVar14->field_0x39 = 0;
      (pLVar14->exception)._M_dataplus = (pointer)0x0;
      (pLVar14->exception)._M_string_length = 0;
      *(undefined1 **)&pLVar14->field_0x80 = &pLVar14->field_0x90;
      *(undefined8 *)(&pLVar14->field_0x80 + 8) = 0;
      pLVar14->field_0x90 = 0;
      IlmThread_3_2::Semaphore::Semaphore((Semaphore *)(pLVar14 + 1),1);
      uVar19 = (long)pcVar18 * 0x10 + 8;
      if (iVar8 < 0) {
        uVar19 = 0xffffffffffffffff;
      }
      plVar15 = (long *)operator_new__(uVar19);
      *plVar15 = (long)pcVar18;
      if (iVar8 != 0) {
        memset(plVar15 + 1,0,(long)pcVar18 * 0x10);
      }
      pcVar3 = pLVar14->buffer;
      if (pcVar3 != (char *)0x0) {
        lVar4 = *(long *)(pcVar3 + -8);
        if (lVar4 != 0) {
          lVar21 = lVar4 << 4;
          do {
            pvVar5 = *(void **)(pcVar3 + -8 + lVar21);
            if (pvVar5 != (void *)0x0) {
              operator_delete__(pvVar5);
            }
            lVar21 = lVar21 + -0x10;
          } while (lVar21 != 0);
        }
        operator_delete__(pcVar3 + -8,lVar4 << 4 | 8);
      }
      pLVar14->uncompressedData = pcVar18;
      pLVar14->buffer = (char *)(plVar15 + 1);
      (this->_data->lineBuffers).
      super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar20] = pLVar14;
      uVar19 = this->_data->maxSampleCountTableSize;
      pLVar14 = (this->_data->lineBuffers).
                super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar20];
      pcVar16 = (pointer)operator_new__(uVar19);
      pcVar6 = (pLVar14->exception)._M_dataplus._M_p;
      if (pcVar6 != (pointer)0x0) {
        operator_delete__(pcVar6);
      }
      *(ulong *)&pLVar14->hasException = uVar19;
      (pLVar14->exception)._M_dataplus._M_p = pcVar16;
      pCVar12 = Header::compression(&this->_data->header);
      pCVar13 = newCompressor(*pCVar12,this->_data->maxSampleCountTableSize,&this->_data->header);
      *(Compressor **)
       ((long)&((this->_data->lineBuffers).
                super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar20]->exception).field_2 + 8) = pCVar13
      ;
      uVar20 = uVar20 + 1;
      pDVar17 = this->_data;
    } while (uVar20 < (ulong)((long)(pDVar17->lineBuffers).
                                    super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pDVar17->lineBuffers).
                                    super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void
DeepScanLineOutputFile::initialize (const Header& header)
{
    _data->header = header;

    _data->header.setType (DEEPSCANLINE);

    const Box2i& dataWindow = header.dataWindow ();

    _data->currentScanLine = (header.lineOrder () == INCREASING_Y)
                                 ? dataWindow.min.y
                                 : dataWindow.max.y;

    _data->missingScanLines = dataWindow.max.y - dataWindow.min.y + 1;
    _data->lineOrder        = header.lineOrder ();
    _data->minX             = dataWindow.min.x;
    _data->maxX             = dataWindow.max.x;
    _data->minY             = dataWindow.min.y;
    _data->maxY             = dataWindow.max.y;

    _data->lineSampleCount.resizeErase (_data->maxY - _data->minY + 1);

    Compressor* compressor =
        newCompressor (_data->header.compression (), 0, _data->header);
    _data->format        = defaultFormat (compressor);
    _data->linesInBuffer = numLinesInBuffer (compressor);
    if (compressor != 0) delete compressor;

    int lineOffsetSize = (_data->maxY - _data->minY + _data->linesInBuffer) /
                         _data->linesInBuffer;

    _data->header.setChunkCount (lineOffsetSize);

    _data->lineOffsets.resize (lineOffsetSize);

    _data->bytesPerLine.resize (_data->maxY - _data->minY + 1);

    _data->maxSampleCountTableSize =
        min (_data->linesInBuffer, _data->maxY - _data->minY + 1) *
        (_data->maxX - _data->minX + 1) * sizeof (unsigned int);

    for (size_t i = 0; i < _data->lineBuffers.size (); ++i)
    {
        _data->lineBuffers[i] = new LineBuffer (_data->linesInBuffer);
        _data->lineBuffers[i]->sampleCountTableBuffer.resizeErase (
            static_cast<long> (_data->maxSampleCountTableSize));

        _data->lineBuffers[i]->sampleCountTableCompressor = newCompressor (
            _data->header.compression (),
            _data->maxSampleCountTableSize,
            _data->header);
    }
}